

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

aiMesh * __thiscall
Assimp::ColladaLoader::CreateMesh
          (ColladaLoader *this,ColladaParser *pParser,Mesh *pSrcMesh,SubMesh *pSubMesh,
          Controller *pSrcController,size_t pStartVertex,size_t pStartFace)

{
  AccessorLibrary *pLibrary;
  DataLibrary *pLibrary_00;
  map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
  *pmVar1;
  MeshLibrary *pLibrary_01;
  pointer *pppaVar2;
  float fVar3;
  float fVar4;
  pointer paVar5;
  Mesh *pSrcMesh_00;
  SubMesh *pSubMesh_00;
  iterator __position;
  pointer puVar6;
  unsigned_long uVar7;
  size_t sVar8;
  iterator __position_00;
  void *__src;
  bool bVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined8 uVar39;
  undefined1 auVar40 [8];
  aiMesh *paVar41;
  aiVector3D *paVar42;
  ulong uVar43;
  aiColor4D *__s;
  ulong *puVar44;
  aiFace *paVar45;
  uint *puVar46;
  Mesh **ppMVar47;
  Accessor *pAVar48;
  Accessor *pAVar49;
  Data *pDVar50;
  Data *pDVar51;
  pointer pbVar52;
  pointer pfVar53;
  Data *pDVar54;
  aiMesh *paVar55;
  aiAnimMesh **ppaVar56;
  Accessor *pAVar57;
  pointer ppVar58;
  aiBone **ppaVar59;
  aiBone *paVar60;
  string *psVar61;
  aiVertexWeight *__s_00;
  Node *pNVar62;
  Logger *this_00;
  runtime_error *prVar63;
  long lVar64;
  aiFace *paVar65;
  ulong uVar66;
  long lVar67;
  size_t sVar68;
  int iVar69;
  long lVar70;
  ulong uVar71;
  Controller *pCVar72;
  long lVar73;
  ColladaParser *pCVar74;
  long lVar75;
  ColladaLoader *pCVar76;
  size_t *psVar77;
  size_t real;
  ColladaLoader *pCVar78;
  aiVertexWeight aVar79;
  pointer pbVar80;
  _Head_base<0UL,_aiMesh_*,_false> _Var81;
  unsigned_long uVar82;
  byte bVar83;
  uint uVar84;
  float fVar85;
  ai_real aVar86;
  undefined4 extraout_XMM0_Db;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> dstMesh;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> targetMeshes;
  vector<float,_std::allocator<float>_> targetWeights;
  aiMesh *aimesh;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  dstBones;
  vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
  weightStartPerVertex;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  _Head_base<0UL,_aiMesh_*,_false> local_2b8;
  ColladaLoader *local_2b0;
  pointer local_2a8;
  pointer local_2a0;
  pointer local_298;
  ColladaLoader *local_290;
  Data *local_288;
  Controller *local_280;
  ColladaParser *local_278;
  ColladaLoader *local_270;
  undefined8 local_268;
  aiMesh **local_258;
  iterator iStack_250;
  aiMesh **local_248;
  void *local_238;
  iterator iStack_230;
  float *local_228;
  aiMesh *local_218 [2];
  undefined1 local_208 [32];
  aiVector3D *local_1e8;
  undefined1 local_1d8 [16];
  aiColor4D *local_1c8;
  Accessor *local_1b8;
  Accessor *local_1b0;
  undefined1 local_1a8 [8];
  aiVertexWeight aStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_290 = (ColladaLoader *)pStartVertex;
  local_280 = pSrcController;
  local_278 = pParser;
  local_270 = this;
  paVar41 = (aiMesh *)operator_new(0x520);
  paVar41->mPrimitiveTypes = 0;
  paVar41->mNumVertices = 0;
  paVar41->mNumFaces = 0;
  local_2b0 = (ColladaLoader *)&paVar41->mVertices;
  memset(local_2b0,0,0xcc);
  paVar41->mBones = (aiBone **)0x0;
  paVar41->mMaterialIndex = 0;
  (paVar41->mName).length = 0;
  (paVar41->mName).data[0] = '\0';
  memset((paVar41->mName).data + 1,0x1b,0x3ff);
  paVar41->mNumAnimMeshes = 0;
  paVar41->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar41->mMethod = 0;
  (paVar41->mAABB).mMin.x = 0.0;
  (paVar41->mAABB).mMin.y = 0.0;
  (paVar41->mAABB).mMin.z = 0.0;
  (paVar41->mAABB).mMax.x = 0.0;
  (paVar41->mAABB).mMax.y = 0.0;
  (paVar41->mAABB).mMax.z = 0.0;
  memset(paVar41->mColors,0,0xa0);
  uVar43 = (pSrcMesh->mName)._M_string_length;
  local_2b8._M_head_impl = paVar41;
  if (uVar43 < 0x400) {
    (paVar41->mName).length = (ai_uint32)uVar43;
    memcpy((paVar41->mName).data,(pSrcMesh->mName)._M_dataplus._M_p,uVar43);
    (paVar41->mName).data[uVar43] = '\0';
  }
  if (pSubMesh->mNumFaces == 0) {
    pbVar52 = (pointer)0x0;
  }
  else {
    lVar67 = 0;
    pbVar52 = (pointer)0x0;
    do {
      pbVar52 = (pointer)((long)&(pbVar52->_M_dataplus)._M_p +
                         *(long *)((long)(pSrcMesh->mFaceSize).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                  lVar67 + pStartFace * 8));
      lVar67 = lVar67 + 8;
    } while (pSubMesh->mNumFaces << 3 != lVar67);
  }
  paVar41->mNumVertices = (uint)pbVar52;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = pbVar52;
  local_2a8 = SUB168(auVar10 * ZEXT816(0xc),0);
  local_2a0 = (pointer)0xffffffffffffffff;
  if (SUB168(auVar10 * ZEXT816(0xc),8) == 0) {
    local_2a0 = local_2a8;
  }
  local_288 = (Data *)pSubMesh;
  paVar42 = (aiVector3D *)operator_new__((ulong)local_2a0);
  pbVar80 = local_2a8;
  if (pbVar52 == (pointer)0x0) {
    *(aiVector3D **)local_2b0 = paVar42;
    pCVar76 = local_290;
  }
  else {
    memset(paVar42,0,((ulong)((long)&local_2a8[-1].field_2 + 4U) / 0xc) * 0xc + 0xc);
    pCVar76 = local_290;
    *(aiVector3D **)local_2b0 = paVar42;
    memmove(paVar42,(pSrcMesh->mPositions).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start + (long)local_290,(size_t)pbVar80);
  }
  paVar5 = (pSrcMesh->mNormals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_2b0 = (ColladaLoader *)
              ((long)&(pCVar76->super_BaseImporter)._vptr_BaseImporter +
              (long)&(pbVar52->_M_dataplus)._M_p);
  if (local_2b0 <=
      (ColladaLoader *)
      (((long)(pSrcMesh->mNormals).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)paVar5 >> 2) * -0x5555555555555555)) {
    paVar42 = (aiVector3D *)operator_new__((ulong)local_2a0);
    pbVar80 = local_2a8;
    if (pbVar52 == (pointer)0x0) {
      paVar41->mNormals = paVar42;
    }
    else {
      memset(paVar42,0,((ulong)((long)&local_2a8[-1].field_2 + 4U) / 0xc) * 0xc + 0xc);
      paVar41->mNormals = paVar42;
      memmove(paVar42,paVar5 + (long)local_290,(size_t)pbVar80);
    }
  }
  paVar5 = (pSrcMesh->mTangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_2b0 <=
      (ColladaLoader *)
      (((long)(pSrcMesh->mTangents).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)paVar5 >> 2) * -0x5555555555555555)) {
    paVar42 = (aiVector3D *)operator_new__((ulong)local_2a0);
    pbVar80 = local_2a8;
    if (pbVar52 == (pointer)0x0) {
      paVar41->mTangents = paVar42;
    }
    else {
      memset(paVar42,0,((ulong)((long)&local_2a8[-1].field_2 + 4U) / 0xc) * 0xc + 0xc);
      paVar41->mTangents = paVar42;
      memmove(paVar42,paVar5 + (long)local_290,(size_t)pbVar80);
    }
  }
  paVar5 = (pSrcMesh->mBitangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_2b0 <=
      (ColladaLoader *)
      (((long)(pSrcMesh->mBitangents).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)paVar5 >> 2) * -0x5555555555555555)) {
    paVar42 = (aiVector3D *)operator_new__((ulong)local_2a0);
    pbVar80 = local_2a8;
    if (pbVar52 == (pointer)0x0) {
      paVar41->mBitangents = paVar42;
    }
    else {
      memset(paVar42,0,((ulong)((long)&local_2a8[-1].field_2 + 4U) / 0xc) * 0xc + 0xc);
      paVar41->mBitangents = paVar42;
      memmove(paVar42,paVar5 + (long)local_290,(size_t)pbVar80);
    }
  }
  local_268 = (Accessor *)pSrcMesh->mTexCoords;
  local_2a8 = (pointer)(((ulong)((long)&local_2a8[-1].field_2 + 4U) / 0xc) * 0xc + 0xc);
  lVar67 = (long)local_290 * 0xc;
  lVar73 = 0;
  lVar70 = 0;
  local_298 = pbVar52;
  do {
    if (local_2b0 <=
        (ColladaLoader *)
        (((long)(local_268->mSubOffset[lVar73 * 3 + -6] - local_268->mSubOffset[lVar73 * 3 + -7]) >>
         2) * -0x5555555555555555)) {
      paVar42 = (aiVector3D *)operator_new__((ulong)local_2a0);
      pbVar52 = local_298;
      if (local_298 == (pointer)0x0) {
        (local_2b8._M_head_impl)->mTextureCoords[lVar70] = paVar42;
      }
      else {
        psVar77 = local_268->mSubOffset;
        memset(paVar42,0,(size_t)local_2a8);
        (local_2b8._M_head_impl)->mTextureCoords[lVar70] = paVar42;
        lVar64 = 0;
        do {
          lVar75 = psVar77[lVar73 * 3 + -7] + lVar67;
          paVar42 = (local_2b8._M_head_impl)->mTextureCoords[lVar70];
          *(undefined4 *)((long)&paVar42->z + lVar64) = *(undefined4 *)(lVar64 + 8 + lVar75);
          *(undefined8 *)((long)&paVar42->x + lVar64) = *(undefined8 *)(lVar64 + lVar75);
          lVar64 = lVar64 + 0xc;
          pbVar52 = (pointer)((long)&pbVar52[-1].field_2 + 0xf);
        } while (pbVar52 != (pointer)0x0);
      }
      (local_2b8._M_head_impl)->mNumUVComponents[lVar70] = pSrcMesh->mNumUVComponents[lVar73];
      lVar70 = lVar70 + 1;
    }
    lVar73 = lVar73 + 1;
  } while (lVar73 != 8);
  uVar43 = (ulong)local_298 >> 0x3c;
  uVar71 = (long)local_298 << 4;
  lVar73 = 0;
  lVar67 = 0x178;
  lVar70 = (long)local_290 * 0x10;
  do {
    if (local_2b0 <=
        (ColladaLoader *)
        (*(long *)((long)&(pSrcMesh->mName)._M_string_length + lVar67) -
         *(long *)((long)&(pSrcMesh->mName)._M_dataplus._M_p + lVar67) >> 4)) {
      __s = (aiColor4D *)operator_new__(-(ulong)(uVar43 != 0) | uVar71);
      if (local_298 == (pointer)0x0) {
        (local_2b8._M_head_impl)->mColors[lVar73] = __s;
      }
      else {
        memset(__s,0,uVar71);
        (local_2b8._M_head_impl)->mColors[lVar73] = __s;
        memmove((local_2b8._M_head_impl)->mColors[lVar73],
                (void *)(*(long *)((long)&(pSrcMesh->mName)._M_dataplus._M_p + lVar67) + lVar70),
                uVar71);
      }
      lVar73 = lVar73 + 1;
    }
    _Var81._M_head_impl = local_2b8._M_head_impl;
    lVar67 = lVar67 + 0x18;
  } while (lVar67 != 0x238);
  pbVar52 = (local_288->mStrings).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar84 = (uint)pbVar52;
  uVar43 = (ulong)pbVar52 & 0xffffffff;
  (local_2b8._M_head_impl)->mNumFaces = uVar84;
  puVar44 = (ulong *)operator_new__(uVar43 * 0x10 + 8);
  pCVar74 = local_278;
  *puVar44 = uVar43;
  paVar45 = (aiFace *)(puVar44 + 1);
  if (uVar84 != 0) {
    paVar65 = paVar45;
    do {
      paVar65->mNumIndices = 0;
      paVar65->mIndices = (uint *)0x0;
      paVar65 = paVar65 + 1;
    } while (paVar65 != paVar45 + uVar43);
  }
  (_Var81._M_head_impl)->mFaces = paVar45;
  if ((_Var81._M_head_impl)->mNumFaces != 0) {
    iVar69 = 0;
    uVar43 = 0;
    do {
      uVar71 = (pSrcMesh->mFaceSize).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar43 + pStartFace];
      paVar45 = (_Var81._M_head_impl)->mFaces;
      paVar45[uVar43].mNumIndices = (uint)uVar71;
      puVar46 = (uint *)operator_new__(-(ulong)(uVar71 >> 0x3e != 0) | uVar71 * 4);
      paVar45[uVar43].mIndices = puVar46;
      if (uVar71 != 0) {
        uVar66 = 0;
        do {
          paVar45[uVar43].mIndices[uVar66] = iVar69 + (int)uVar66;
          uVar66 = uVar66 + 1;
        } while (uVar71 != uVar66);
        iVar69 = iVar69 + (int)uVar66;
      }
      uVar43 = uVar43 + 1;
      _Var81._M_head_impl = local_2b8._M_head_impl;
    } while (uVar43 < (local_2b8._M_head_impl)->mNumFaces);
  }
  local_258 = (aiMesh **)0x0;
  iStack_250._M_current = (aiMesh **)0x0;
  local_248 = (aiMesh **)0x0;
  local_228 = (float *)0x0;
  local_238 = (void *)0x0;
  iStack_230._M_current = (float *)0x0;
  pDVar54 = (Data *)(pCVar74->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
  pDVar50 = (Data *)&(pCVar74->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header;
  if (pDVar54 != pDVar50) {
    local_298 = (pointer)0x0;
    pLibrary_01 = &pCVar74->mMeshLibrary;
    local_2a0 = (pointer)&pCVar74->mAccessorLibrary;
    local_2a8 = (pointer)&pCVar74->mDataLibrary;
    local_268 = (Accessor *)&local_270->mTargetMeshes;
    local_288 = pDVar50;
    do {
      ppMVar47 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Mesh*>
                           (pCVar74,pLibrary_01,
                            (string *)
                            &pDVar54[1].mValues.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
      if (*(int *)&pDVar54[1].mValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start == 1) {
        sVar68 = ((*ppMVar47)->mName)._M_string_length;
        if ((sVar68 == (pSrcMesh->mName)._M_string_length) &&
           ((sVar68 == 0 ||
            (iVar69 = bcmp(((*ppMVar47)->mName)._M_dataplus._M_p,(pSrcMesh->mName)._M_dataplus._M_p,
                           sVar68), iVar69 == 0)))) {
          pbVar52 = local_2a0;
          pAVar48 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                              (pCVar74,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
                                        *)local_2a0,
                               (string *)
                               &pDVar54[7].mValues.super__Vector_base<float,_std::allocator<float>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
          pAVar49 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                              (pCVar74,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
                                        *)pbVar52,
                               (string *)
                               &pDVar54[7].mStrings.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pbVar52 = local_2a8;
          pDVar50 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                              (pCVar74,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
                                        *)local_2a8,&pAVar48->mSource);
          pDVar51 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                              (pCVar74,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
                                        *)pbVar52,&pAVar49->mSource);
          if (pDVar50->mIsStringArray == false) {
            prVar63 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1a8 = (undefined1  [8])local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"target data must contain id. ","");
            std::runtime_error::runtime_error(prVar63,(string *)local_1a8);
            *(undefined ***)prVar63 = &PTR__runtime_error_008bf448;
            __cxa_throw(prVar63,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (pDVar51->mIsStringArray != false) {
            prVar63 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1a8 = (undefined1  [8])local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"target weight data must not be textual ","");
            std::runtime_error::runtime_error(prVar63,(string *)local_1a8);
            *(undefined ***)prVar63 = &PTR__runtime_error_008bf448;
            __cxa_throw(prVar63,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          local_298 = (pointer)(ulong)*(uint *)((long)&pDVar54[1].mValues.
                                                                                                              
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 4);
          pbVar52 = (pDVar50->mStrings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pDVar50->mStrings).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != pbVar52) {
            uVar43 = 0;
            uVar71 = 1;
            do {
              ppMVar47 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Mesh*>
                                   (local_278,pLibrary_01,pbVar52 + uVar43);
              pSrcMesh_00 = *ppMVar47;
              local_218[0] = findMesh(local_270,&pSrcMesh_00->mName);
              if (local_218[0] == (aiMesh *)0x0) {
                pSubMesh_00 = (pSrcMesh_00->mSubMeshes).
                              super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                lVar67 = (long)(pSrcMesh_00->mSubMeshes).
                               super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSubMesh_00;
                if (1 < (ulong)((lVar67 >> 3) * -0x3333333333333333)) {
                  prVar63 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_1a8 = (undefined1  [8])local_198;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,"Morhing target mesh must be a single","");
                  std::runtime_error::runtime_error(prVar63,(string *)local_1a8);
                  *(undefined ***)prVar63 = &PTR__runtime_error_008bf448;
                  __cxa_throw(prVar63,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                if (lVar67 != 0x28) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0);
                }
                local_218[0] = CreateMesh(local_270,local_278,pSrcMesh_00,pSubMesh_00,
                                          (Controller *)0x0,0,0);
                __position._M_current =
                     (local_270->mTargetMeshes).
                     super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (local_270->mTargetMeshes).
                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                            ((vector<aiMesh*,std::allocator<aiMesh*>> *)local_268,__position,
                             local_218);
                }
                else {
                  *__position._M_current = local_218[0];
                  pppaVar2 = &(local_270->mTargetMeshes).
                              super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppaVar2 = *pppaVar2 + 1;
                }
              }
              if (iStack_250._M_current == local_248) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_258,iStack_250,
                           local_218);
              }
              else {
                *iStack_250._M_current = local_218[0];
                iStack_250._M_current = iStack_250._M_current + 1;
              }
              pbVar52 = (pDVar50->mStrings).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar9 = uVar71 < (ulong)((long)(pDVar50->mStrings).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pbVar52 >> 5);
              uVar43 = uVar71;
              uVar71 = (ulong)((int)uVar71 + 1);
            } while (bVar9);
          }
          pfVar53 = (pDVar51->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar74 = local_278;
          pDVar50 = local_288;
          if ((pDVar51->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish != pfVar53) {
            uVar43 = 0;
            uVar71 = 1;
            do {
              if (iStack_230._M_current == local_228) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_238,iStack_230,
                           pfVar53 + uVar43);
              }
              else {
                *iStack_230._M_current = pfVar53[uVar43];
                iStack_230._M_current = iStack_230._M_current + 1;
              }
              pfVar53 = (pDVar51->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl
                        .super__Vector_impl_data._M_start;
              bVar9 = uVar71 < (ulong)((long)(pDVar51->mValues).
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)pfVar53 >> 2);
              uVar43 = uVar71;
              pCVar74 = local_278;
              uVar71 = (ulong)((int)uVar71 + 1);
              pDVar50 = local_288;
            } while (bVar9);
          }
        }
      }
      pDVar54 = (Data *)std::_Rb_tree_increment((_Rb_tree_node_base *)pDVar54);
    } while (pDVar54 != pDVar50);
    bVar83 = (int)local_298 == 1;
    if (((long)iStack_250._M_current - (long)local_258 != 0) &&
       ((long)iStack_230._M_current - (long)local_238 >> 2 ==
        (long)iStack_250._M_current - (long)local_258 >> 3)) {
      local_1a8._0_4_ = 0;
      local_1a8._4_4_ = 0.0;
      aStack_1a0.mVertexId = 0;
      aStack_1a0.mWeight = 0.0;
      local_198[0]._0_4_ = 0;
      local_198[0]._4_4_ = 0.0;
      if (iStack_250._M_current != local_258) {
        local_268 = (Accessor *)CONCAT71(local_268._1_7_,bVar83);
        uVar43 = 0;
        uVar71 = 1;
        do {
          paVar41 = local_258[uVar43];
          paVar55 = (aiMesh *)aiCreateAnimMesh(paVar41);
          fVar85 = *(float *)((long)local_238 + uVar43 * 4);
          uVar84 = -(uint)(fVar85 == 0.0);
          *(uint *)((paVar55->mName).data + 0x3bc) = uVar84 & 0x3f800000 | ~uVar84 & (uint)fVar85;
          local_218[0] = paVar55;
          if (paVar55 != (aiMesh *)&paVar41->mName) {
            uVar84 = (paVar41->mName).length;
            paVar55->mPrimitiveTypes = uVar84;
            memcpy(&paVar55->mNumVertices,(paVar41->mName).data,(ulong)uVar84);
            *(undefined1 *)((long)paVar55->mColors + ((ulong)uVar84 - 0x2c)) = 0;
          }
          if (aStack_1a0 == (aiVertexWeight)local_198[0]._0_8_) {
            std::vector<aiAnimMesh*,std::allocator<aiAnimMesh*>>::
            _M_realloc_insert<aiAnimMesh*const&>
                      ((vector<aiAnimMesh*,std::allocator<aiAnimMesh*>> *)local_1a8,
                       (iterator)aStack_1a0,(aiAnimMesh **)local_218);
          }
          else {
            *(aiMesh **)aStack_1a0 = local_218[0];
            aStack_1a0 = (aiVertexWeight)((long)aStack_1a0 + 8);
          }
          bVar9 = uVar71 < (ulong)((long)iStack_250._M_current - (long)local_258 >> 3);
          uVar43 = uVar71;
          uVar71 = (ulong)((int)uVar71 + 1);
        } while (bVar9);
        pCVar74 = local_278;
        bVar83 = (byte)local_268;
      }
      aVar79 = (aiVertexWeight)local_1a8;
      _Var81._M_head_impl = local_2b8._M_head_impl;
      (local_2b8._M_head_impl)->mMethod = bVar83 | 2;
      uVar43 = (long)aStack_1a0 - (long)local_1a8 >> 3;
      ppaVar56 = (aiAnimMesh **)
                 operator_new__(-(ulong)(uVar43 >> 0x3d != 0) | (long)aStack_1a0 - (long)local_1a8);
      (_Var81._M_head_impl)->mAnimMeshes = ppaVar56;
      (_Var81._M_head_impl)->mNumAnimMeshes = (uint)uVar43;
      if (aStack_1a0 != aVar79) {
        uVar84 = 1;
        uVar43 = 0;
        do {
          (local_2b8._M_head_impl)->mAnimMeshes[uVar43] =
               *(aiAnimMesh **)((long)aVar79 + uVar43 * 8);
          uVar43 = (ulong)uVar84;
          uVar84 = uVar84 + 1;
          aVar79 = (aiVertexWeight)local_1a8;
        } while (uVar43 < (ulong)((long)aStack_1a0 - (long)local_1a8 >> 3));
      }
      if (aVar79 != (aiVertexWeight)0x0) {
        operator_delete((void *)aVar79,local_198[0]._M_allocated_capacity - (long)aVar79);
      }
    }
  }
  if ((local_280 != (Controller *)0x0) && (local_280->mType == Skin)) {
    pLibrary = &pCVar74->mAccessorLibrary;
    pAVar48 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pCVar74,pLibrary,&local_280->mJointNameSource);
    pLibrary_00 = &pCVar74->mDataLibrary;
    local_288 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                          (pCVar74,pLibrary_00,&pAVar48->mSource);
    pAVar49 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pCVar74,pLibrary,&local_280->mJointOffsetMatrixSource);
    local_208._16_8_ =
         ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                   (pCVar74,pLibrary_00,&pAVar49->mSource);
    pAVar57 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pCVar74,pLibrary,&(local_280->mWeightInputJoints).mAccessor);
    if (pAVar57 != pAVar48) {
      prVar63 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,
                 "Temporary implementational laziness. If you read this, please report to the author."
                 ,"");
      std::runtime_error::runtime_error(prVar63,(string *)local_1a8);
      *(undefined ***)prVar63 = &PTR__runtime_error_008bf448;
      __cxa_throw(prVar63,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pAVar57 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pCVar74,pLibrary,&(local_280->mWeightInputWeights).mAccessor);
    pDVar50 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                        (pCVar74,pLibrary_00,&pAVar57->mSource);
    pCVar72 = local_280;
    if (((local_288->mIsStringArray != true) || (*(bool *)local_208._16_8_ != false)) ||
       (pDVar50->mIsStringArray == true)) {
      prVar63 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Data type mismatch while resolving mesh joints","");
      std::runtime_error::runtime_error(prVar63,(string *)local_1a8);
      *(undefined ***)prVar63 = &PTR__runtime_error_008bf448;
      __cxa_throw(prVar63,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_268 = pAVar57;
    if (((local_280->mWeightInputJoints).mOffset != 0) ||
       ((local_280->mWeightInputWeights).mOffset != 1)) {
      prVar63 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Unsupported vertex_weight addressing scheme. ","");
      std::runtime_error::runtime_error(prVar63,(string *)local_1a8);
      *(undefined ***)prVar63 = &PTR__runtime_error_008bf448;
      __cxa_throw(prVar63,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pbVar52 = (local_288->mStrings).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar80 = (local_288->mStrings).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_2a8 = (pointer)((long)pbVar80 - (long)pbVar52 >> 5);
    std::
    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
    ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
              *)(local_208 + 0x18),(size_type)local_2a8,(allocator_type *)local_1a8);
    pCVar76 = (ColladaLoader *)local_1d8;
    local_1d8._0_8_ = (aiColor4D *)0x0;
    local_1d8._8_8_ = (aiColor4D *)0x0;
    local_1c8 = (aiColor4D *)0x0;
    local_1a8 = (undefined1  [8])
                (pCVar72->mWeights).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
    ::resize((vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
              *)pCVar76,
             (long)(pCVar72->mWeightCounts).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pCVar72->mWeightCounts).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type *)local_1a8);
    if ((pCVar72->mWeightCounts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (pCVar72->mWeightCounts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      ppVar58 = (pCVar72->mWeights).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar43 = 0;
      do {
        *(pointer *)((float *)local_1d8._0_8_ + uVar43 * 2) = ppVar58;
        puVar6 = (pCVar72->mWeightCounts).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pCVar76 = (ColladaLoader *)(puVar6[uVar43] * 0x10);
        ppVar58 = (pointer)((long)&ppVar58->first +
                           (long)&(pCVar76->super_BaseImporter)._vptr_BaseImporter);
        uVar43 = uVar43 + 1;
      } while (uVar43 < (ulong)((long)(pCVar72->mWeightCounts).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3
                               ));
    }
    pCVar78 = local_290;
    local_2a0 = pbVar80;
    local_298 = pbVar52;
    local_1b8 = pAVar49;
    local_1b0 = pAVar48;
    if (local_290 < local_2b0) {
      do {
        uVar7 = (pSrcMesh->mFacePosIndices).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[(long)pCVar78];
        uVar82 = (pCVar72->mWeightCounts).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
        if (uVar82 != 0) {
          uVar84 = (int)pCVar78 - (int)local_290;
          psVar77 = (size_t *)(*(long *)((float *)local_1d8._0_8_ + uVar7 * 2) + 8);
          do {
            sVar8 = psVar77[-1];
            fVar85 = 1.0;
            if (((pDVar50->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 (pDVar50->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish) ||
               (fVar85 = ReadFloat(pCVar76,local_268,pDVar50,*psVar77,0), 0.0 < fVar85)) {
              local_1a8._4_4_ = fVar85;
              local_1a8._0_4_ = uVar84;
              pCVar76 = (ColladaLoader *)(local_208._24_8_ + sVar8 * 2 * 0xc);
              __position_00._M_current =
                   *(aiVertexWeight **)&(pCVar76->super_BaseImporter).importerUnits._M_t._M_impl;
              if (__position_00._M_current ==
                  *(aiVertexWeight **)
                   &(pCVar76->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header.
                    _M_header) {
                std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                _M_realloc_insert<aiVertexWeight_const&>
                          ((vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)pCVar76,
                           __position_00,(aiVertexWeight *)local_1a8);
              }
              else {
                (__position_00._M_current)->mVertexId = uVar84;
                (__position_00._M_current)->mWeight = fVar85;
                pmVar1 = &(pCVar76->super_BaseImporter).importerUnits;
                *(long *)&(pmVar1->_M_t)._M_impl = *(long *)&(pmVar1->_M_t)._M_impl + 8;
              }
            }
            psVar77 = psVar77 + 2;
            uVar82 = uVar82 - 1;
          } while (uVar82 != 0);
        }
        pCVar78 = (ColladaLoader *)((long)&(pCVar78->super_BaseImporter)._vptr_BaseImporter + 1);
        pCVar72 = local_280;
      } while (pCVar78 != local_2b0);
    }
    pbVar80 = local_298;
    pbVar52 = local_2a0;
    _Var81._M_head_impl = local_2b8._M_head_impl;
    if ((aiVector3D *)local_208._24_8_ == local_1e8) {
      (local_2b8._M_head_impl)->mNumBones = 0;
      uVar43 = 0;
    }
    else {
      uVar43 = 0;
      paVar42 = (aiVector3D *)local_208._24_8_;
      do {
        lVar67._0_4_ = paVar42->x;
        lVar67._4_4_ = paVar42->y;
        uVar43 = uVar43 + (*(long *)&paVar42->z != lVar67);
        paVar42 = paVar42 + 2;
      } while (paVar42 != local_1e8);
      (local_2b8._M_head_impl)->mNumBones = (uint)uVar43;
      uVar43 = -(ulong)(uVar43 >> 0x3d != 0) | uVar43 * 8;
    }
    ppaVar59 = (aiBone **)operator_new__(uVar43);
    (_Var81._M_head_impl)->mBones = ppaVar59;
    if (pbVar52 != pbVar80) {
      local_2a8 = (pointer)((long)&(local_2a8->_M_dataplus)._M_p +
                           (ulong)(local_2a8 == (pointer)0x0));
      lVar67 = 8;
      pbVar52 = (pointer)0x0;
      pbVar80 = (pointer)0x0;
      do {
        if (*(long *)(local_208._24_8_ + lVar67 + -8) !=
            *(long *)((long)(float *)local_208._24_8_ + lVar67)) {
          local_2a0 = pbVar80;
          paVar60 = (aiBone *)operator_new(0x450);
          (paVar60->mName).length = 0;
          local_2b0 = (ColladaLoader *)(paVar60->mName).data;
          (paVar60->mName).data[0] = '\0';
          pCVar76 = (ColladaLoader *)((paVar60->mName).data + 1);
          memset(pCVar76,0x1b,0x3ff);
          paVar60->mNumWeights = 0;
          paVar60->mWeights = (aiVertexWeight *)0x0;
          (paVar60->mOffsetMatrix).a1 = 1.0;
          (paVar60->mOffsetMatrix).a2 = 0.0;
          (paVar60->mOffsetMatrix).a3 = 0.0;
          (paVar60->mOffsetMatrix).a4 = 0.0;
          (paVar60->mOffsetMatrix).b1 = 0.0;
          (paVar60->mOffsetMatrix).b2 = 1.0;
          (paVar60->mOffsetMatrix).b3 = 0.0;
          (paVar60->mOffsetMatrix).b4 = 0.0;
          (paVar60->mOffsetMatrix).c1 = 0.0;
          (paVar60->mOffsetMatrix).c2 = 0.0;
          (paVar60->mOffsetMatrix).c3 = 1.0;
          (paVar60->mOffsetMatrix).c4 = 0.0;
          (paVar60->mOffsetMatrix).d1 = 0.0;
          (paVar60->mOffsetMatrix).d2 = 0.0;
          (paVar60->mOffsetMatrix).d3 = 0.0;
          (paVar60->mOffsetMatrix).d4 = 1.0;
          psVar61 = ReadString_abi_cxx11_(pCVar76,local_1b0,local_288,(size_t)pbVar52);
          uVar43 = psVar61->_M_string_length;
          if (uVar43 < 0x400) {
            (paVar60->mName).length = (ai_uint32)uVar43;
            pCVar76 = local_2b0;
            memcpy(local_2b0,(psVar61->_M_dataplus)._M_p,uVar43);
            (paVar60->mName).data[uVar43] = '\0';
          }
          pAVar48 = local_1b8;
          uVar39 = local_208._16_8_;
          aVar86 = ReadFloat(pCVar76,local_1b8,(Data *)local_208._16_8_,(size_t)pbVar52,0);
          (paVar60->mOffsetMatrix).a1 = aVar86;
          aVar86 = ReadFloat(pCVar76,pAVar48,(Data *)uVar39,(size_t)pbVar52,1);
          (paVar60->mOffsetMatrix).a2 = aVar86;
          aVar86 = ReadFloat(pCVar76,pAVar48,(Data *)uVar39,(size_t)pbVar52,2);
          (paVar60->mOffsetMatrix).a3 = aVar86;
          aVar86 = ReadFloat(pCVar76,pAVar48,(Data *)uVar39,(size_t)pbVar52,3);
          (paVar60->mOffsetMatrix).a4 = aVar86;
          aVar86 = ReadFloat(pCVar76,pAVar48,(Data *)uVar39,(size_t)pbVar52,4);
          (paVar60->mOffsetMatrix).b1 = aVar86;
          aVar86 = ReadFloat(pCVar76,pAVar48,(Data *)uVar39,(size_t)pbVar52,5);
          (paVar60->mOffsetMatrix).b2 = aVar86;
          aVar86 = ReadFloat(pCVar76,pAVar48,(Data *)uVar39,(size_t)pbVar52,6);
          (paVar60->mOffsetMatrix).b3 = aVar86;
          aVar86 = ReadFloat(pCVar76,pAVar48,(Data *)uVar39,(size_t)pbVar52,7);
          (paVar60->mOffsetMatrix).b4 = aVar86;
          aVar86 = ReadFloat(pCVar76,pAVar48,(Data *)uVar39,(size_t)pbVar52,8);
          (paVar60->mOffsetMatrix).c1 = aVar86;
          aVar86 = ReadFloat(pCVar76,pAVar48,(Data *)uVar39,(size_t)pbVar52,9);
          (paVar60->mOffsetMatrix).c2 = aVar86;
          aVar86 = ReadFloat(pCVar76,pAVar48,(Data *)uVar39,(size_t)pbVar52,10);
          (paVar60->mOffsetMatrix).c3 = aVar86;
          aVar86 = ReadFloat(pCVar76,pAVar48,(Data *)uVar39,(size_t)pbVar52,0xb);
          uVar39 = local_208._24_8_;
          local_268 = (Accessor *)CONCAT44(extraout_XMM0_Db,aVar86);
          (paVar60->mOffsetMatrix).c4 = aVar86;
          uVar71 = *(long *)((long)(float *)local_208._24_8_ + lVar67) -
                   *(long *)(local_208._24_8_ + lVar67 + -8) >> 3;
          paVar60->mNumWeights = (uint)uVar71;
          uVar71 = uVar71 & 0xffffffff;
          uVar43 = uVar71 * 8;
          __s_00 = (aiVertexWeight *)operator_new__(uVar43);
          if (uVar71 != 0) {
            memset(__s_00,0,uVar43);
          }
          paVar60->mWeights = __s_00;
          __src = *(void **)(uVar39 + lVar67 + -8);
          sVar68 = *(long *)((long)(float *)uVar39 + lVar67) - (long)__src;
          local_298 = pbVar52;
          if (sVar68 != 0) {
            memmove(__s_00,__src,sVar68);
          }
          pCVar74 = local_278;
          pCVar76 = local_2b0;
          fVar11 = (paVar60->mOffsetMatrix).a1;
          fVar12 = (paVar60->mOffsetMatrix).a2;
          fVar13 = (paVar60->mOffsetMatrix).a3;
          fVar14 = (paVar60->mOffsetMatrix).a4;
          fVar15 = (paVar60->mOffsetMatrix).b1;
          fVar16 = (paVar60->mOffsetMatrix).b2;
          fVar17 = (paVar60->mOffsetMatrix).b3;
          fVar18 = (paVar60->mOffsetMatrix).b4;
          fVar19 = (paVar60->mOffsetMatrix).c1;
          fVar20 = (paVar60->mOffsetMatrix).c2;
          fVar21 = (paVar60->mOffsetMatrix).c3;
          fVar22 = (paVar60->mOffsetMatrix).d1;
          fVar23 = local_280->mBindShapeMatrix[0];
          fVar24 = local_280->mBindShapeMatrix[1];
          fVar25 = local_280->mBindShapeMatrix[2];
          fVar26 = local_280->mBindShapeMatrix[3];
          fVar27 = local_280->mBindShapeMatrix[4];
          fVar28 = local_280->mBindShapeMatrix[5];
          fVar29 = local_280->mBindShapeMatrix[6];
          fVar30 = local_280->mBindShapeMatrix[7];
          fVar31 = local_280->mBindShapeMatrix[8];
          fVar32 = local_280->mBindShapeMatrix[9];
          fVar33 = local_280->mBindShapeMatrix[10];
          fVar34 = local_280->mBindShapeMatrix[0xb];
          fVar35 = local_280->mBindShapeMatrix[0xc];
          fVar36 = local_280->mBindShapeMatrix[0xd];
          fVar37 = local_280->mBindShapeMatrix[0xe];
          fVar38 = local_280->mBindShapeMatrix[0xf];
          fVar85 = (paVar60->mOffsetMatrix).d2;
          fVar3 = (paVar60->mOffsetMatrix).d3;
          fVar4 = (paVar60->mOffsetMatrix).d4;
          (paVar60->mOffsetMatrix).a1 =
               fVar14 * fVar35 + fVar13 * fVar31 + fVar11 * fVar23 + fVar12 * fVar27;
          (paVar60->mOffsetMatrix).a2 =
               fVar14 * fVar36 + fVar13 * fVar32 + fVar11 * fVar24 + fVar12 * fVar28;
          (paVar60->mOffsetMatrix).a3 =
               fVar14 * fVar37 + fVar13 * fVar33 + fVar11 * fVar25 + fVar12 * fVar29;
          (paVar60->mOffsetMatrix).a4 =
               fVar14 * fVar38 + fVar13 * fVar34 + fVar11 * fVar26 + fVar12 * fVar30;
          (paVar60->mOffsetMatrix).b1 =
               fVar18 * fVar35 + fVar17 * fVar31 + fVar15 * fVar23 + fVar16 * fVar27;
          (paVar60->mOffsetMatrix).b2 =
               fVar18 * fVar36 + fVar17 * fVar32 + fVar15 * fVar24 + fVar16 * fVar28;
          (paVar60->mOffsetMatrix).b3 =
               fVar18 * fVar37 + fVar17 * fVar33 + fVar15 * fVar25 + fVar16 * fVar29;
          (paVar60->mOffsetMatrix).b4 =
               fVar18 * fVar38 + fVar17 * fVar34 + fVar15 * fVar26 + fVar16 * fVar30;
          (paVar60->mOffsetMatrix).c1 =
               (float)local_268 * fVar35 + fVar21 * fVar31 + fVar19 * fVar23 + fVar20 * fVar27;
          (paVar60->mOffsetMatrix).c2 =
               (float)local_268 * fVar36 + fVar21 * fVar32 + fVar19 * fVar24 + fVar20 * fVar28;
          (paVar60->mOffsetMatrix).c3 =
               (float)local_268 * fVar37 + fVar21 * fVar33 + fVar19 * fVar25 + fVar20 * fVar29;
          (paVar60->mOffsetMatrix).c4 =
               (float)local_268 * fVar38 + fVar21 * fVar34 + fVar19 * fVar26 + fVar20 * fVar30;
          (paVar60->mOffsetMatrix).d1 =
               fVar4 * fVar35 + fVar3 * fVar31 + fVar22 * fVar23 + fVar85 * fVar27;
          (paVar60->mOffsetMatrix).d2 =
               fVar4 * fVar36 + fVar3 * fVar32 + fVar22 * fVar24 + fVar85 * fVar28;
          (paVar60->mOffsetMatrix).d3 =
               fVar4 * fVar37 + fVar3 * fVar33 + fVar22 * fVar25 + fVar85 * fVar29;
          (paVar60->mOffsetMatrix).d4 =
               fVar4 * fVar38 + fVar3 * fVar34 + fVar22 * fVar26 + fVar85 * fVar30;
          pNVar62 = local_278->mRootNode;
          local_1a8 = (undefined1  [8])local_198;
          sVar68 = strlen((char *)local_2b0);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,pCVar76,
                     (char *)((long)&(pCVar76->super_BaseImporter)._vptr_BaseImporter + sVar68));
          pNVar62 = FindNode(local_270,pNVar62,(string *)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
          }
          pbVar52 = local_298;
          pCVar76 = local_2b0;
          pCVar78 = local_270;
          if (pNVar62 == (Node *)0x0) {
            pNVar62 = pCVar74->mRootNode;
            local_1a8 = (undefined1  [8])local_198;
            sVar68 = strlen((char *)local_2b0);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,pCVar76,
                       (char *)((long)&(pCVar76->super_BaseImporter)._vptr_BaseImporter + sVar68));
            pCVar78 = local_270;
            pNVar62 = FindNodeBySID(local_270,pNVar62,(string *)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
            }
            if (pNVar62 != (Node *)0x0) goto LAB_003f3618;
            this_00 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[75]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,
                       (char (*) [75])
                       "ColladaLoader::CreateMesh(): could not find corresponding node for joint \""
                      );
            pCVar76 = local_2b0;
            sVar68 = strlen((char *)local_2b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)pCVar76,sVar68);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
            std::__cxx11::stringbuf::str();
            Logger::warn(this_00,(char *)local_218[0]);
            pbVar80 = local_2a0;
            if (local_218[0] != (aiMesh *)local_208) {
              operator_delete(local_218[0],local_208._0_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          else {
LAB_003f3618:
            FindNameForNode_abi_cxx11_((string *)local_1a8,pCVar78,pNVar62);
            aVar79 = aStack_1a0;
            auVar40 = local_1a8;
            if ((ulong)aStack_1a0 < 0x400) {
              (paVar60->mName).length = aStack_1a0.mVertexId;
              memcpy(local_2b0,(void *)local_1a8,(size_t)aStack_1a0);
              (paVar60->mName).data[(long)aVar79] = '\0';
            }
            pbVar80 = local_2a0;
            if (auVar40 != (undefined1  [8])local_198) {
              operator_delete((void *)auVar40,local_198[0]._M_allocated_capacity + 1);
              pbVar80 = local_2a0;
            }
          }
          (local_2b8._M_head_impl)->mBones[(long)pbVar80] = paVar60;
          pbVar80 = (pointer)((long)&(pbVar80->_M_dataplus)._M_p + 1);
        }
        pbVar52 = (pointer)((long)&(pbVar52->_M_dataplus)._M_p + 1);
        lVar67 = lVar67 + 0x18;
      } while (local_2a8 != pbVar52);
    }
    if ((aiColor4D *)local_1d8._0_8_ != (aiColor4D *)0x0) {
      operator_delete((void *)local_1d8._0_8_,(long)local_1c8 - local_1d8._0_8_);
    }
    std::
    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
    ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
               *)(local_208 + 0x18));
  }
  _Var81._M_head_impl = local_2b8._M_head_impl;
  local_2b8._M_head_impl = (aiMesh *)0x0;
  if (local_238 != (void *)0x0) {
    operator_delete(local_238,(long)local_228 - (long)local_238);
  }
  if (local_258 != (aiMesh **)0x0) {
    operator_delete(local_258,(long)local_248 - (long)local_258);
  }
  std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr
            ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&local_2b8);
  return _Var81._M_head_impl;
}

Assistant:

aiMesh* ColladaLoader::CreateMesh(const ColladaParser& pParser, const Collada::Mesh* pSrcMesh, const Collada::SubMesh& pSubMesh,
    const Collada::Controller* pSrcController, size_t pStartVertex, size_t pStartFace) {
    std::unique_ptr<aiMesh> dstMesh(new aiMesh);

    dstMesh->mName = pSrcMesh->mName;

    // count the vertices addressed by its faces
    const size_t numVertices = std::accumulate(pSrcMesh->mFaceSize.begin() + pStartFace,
        pSrcMesh->mFaceSize.begin() + pStartFace + pSubMesh.mNumFaces, size_t(0));

    // copy positions
    dstMesh->mNumVertices = static_cast<unsigned int>(numVertices);
    dstMesh->mVertices = new aiVector3D[numVertices];
    std::copy(pSrcMesh->mPositions.begin() + pStartVertex, pSrcMesh->mPositions.begin() +
        pStartVertex + numVertices, dstMesh->mVertices);

    // normals, if given. HACK: (thom) Due to the glorious Collada spec we never
    // know if we have the same number of normals as there are positions. So we
    // also ignore any vertex attribute if it has a different count
    if (pSrcMesh->mNormals.size() >= pStartVertex + numVertices) {
        dstMesh->mNormals = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mNormals.begin() + pStartVertex, pSrcMesh->mNormals.begin() +
            pStartVertex + numVertices, dstMesh->mNormals);
    }

    // tangents, if given.
    if (pSrcMesh->mTangents.size() >= pStartVertex + numVertices) {
        dstMesh->mTangents = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mTangents.begin() + pStartVertex, pSrcMesh->mTangents.begin() +
            pStartVertex + numVertices, dstMesh->mTangents);
    }

    // bitangents, if given.
    if (pSrcMesh->mBitangents.size() >= pStartVertex + numVertices) {
        dstMesh->mBitangents = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mBitangents.begin() + pStartVertex, pSrcMesh->mBitangents.begin() +
            pStartVertex + numVertices, dstMesh->mBitangents);
    }

    // same for texturecoords, as many as we have
    // empty slots are not allowed, need to pack and adjust UV indexes accordingly
    for (size_t a = 0, real = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a) {
        if (pSrcMesh->mTexCoords[a].size() >= pStartVertex + numVertices) {
            dstMesh->mTextureCoords[real] = new aiVector3D[numVertices];
            for (size_t b = 0; b < numVertices; ++b) {
                dstMesh->mTextureCoords[real][b] = pSrcMesh->mTexCoords[a][pStartVertex + b];
            }

            dstMesh->mNumUVComponents[real] = pSrcMesh->mNumUVComponents[a];
            ++real;
        }
    }

    // same for vertex colors, as many as we have. again the same packing to avoid empty slots
    for (size_t a = 0, real = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a) {
        if (pSrcMesh->mColors[a].size() >= pStartVertex + numVertices) {
            dstMesh->mColors[real] = new aiColor4D[numVertices];
            std::copy(pSrcMesh->mColors[a].begin() + pStartVertex, pSrcMesh->mColors[a].begin() + pStartVertex + numVertices, dstMesh->mColors[real]);
            ++real;
        }
    }

    // create faces. Due to the fact that each face uses unique vertices, we can simply count up on each vertex
    size_t vertex = 0;
    dstMesh->mNumFaces = static_cast<unsigned int>(pSubMesh.mNumFaces);
    dstMesh->mFaces = new aiFace[dstMesh->mNumFaces];
    for (size_t a = 0; a < dstMesh->mNumFaces; ++a) {
        size_t s = pSrcMesh->mFaceSize[pStartFace + a];
        aiFace& face = dstMesh->mFaces[a];
        face.mNumIndices = static_cast<unsigned int>(s);
        face.mIndices = new unsigned int[s];
        for (size_t b = 0; b < s; ++b) {
            face.mIndices[b] = static_cast<unsigned int>(vertex++);
        }
    }

    // create morph target meshes if any
    std::vector<aiMesh*> targetMeshes;
    std::vector<float> targetWeights;
    Collada::MorphMethod method = Collada::Normalized;

    for (std::map<std::string, Collada::Controller>::const_iterator it = pParser.mControllerLibrary.begin();
        it != pParser.mControllerLibrary.end(); ++it) {
        const Collada::Controller &c = it->second;
        const Collada::Mesh* baseMesh = pParser.ResolveLibraryReference(pParser.mMeshLibrary, c.mMeshId);

        if (c.mType == Collada::Morph && baseMesh->mName == pSrcMesh->mName) {
            const Collada::Accessor& targetAccessor = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, c.mMorphTarget);
            const Collada::Accessor& weightAccessor = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, c.mMorphWeight);
            const Collada::Data& targetData = pParser.ResolveLibraryReference(pParser.mDataLibrary, targetAccessor.mSource);
            const Collada::Data& weightData = pParser.ResolveLibraryReference(pParser.mDataLibrary, weightAccessor.mSource);

            // take method
            method = c.mMethod;

            if (!targetData.mIsStringArray) {
                throw DeadlyImportError("target data must contain id. ");
            }
            if (weightData.mIsStringArray) {
                throw DeadlyImportError("target weight data must not be textual ");
            }

            for (unsigned int i = 0; i < targetData.mStrings.size(); ++i) {
                const Collada::Mesh* targetMesh = pParser.ResolveLibraryReference(pParser.mMeshLibrary, targetData.mStrings.at(i));

                aiMesh *aimesh = findMesh(targetMesh->mName);
                if (!aimesh) {
                    if (targetMesh->mSubMeshes.size() > 1) {
                        throw DeadlyImportError("Morhing target mesh must be a single");
                    }
                    aimesh = CreateMesh(pParser, targetMesh, targetMesh->mSubMeshes.at(0), NULL, 0, 0);
                    mTargetMeshes.push_back(aimesh);
                }
                targetMeshes.push_back(aimesh);
            }
            for (unsigned int i = 0; i < weightData.mValues.size(); ++i) {
                targetWeights.push_back(weightData.mValues.at(i));
            }
        }
    }
    if (targetMeshes.size() > 0 && targetWeights.size() == targetMeshes.size()) {
        std::vector<aiAnimMesh*> animMeshes;
        for (unsigned int i = 0; i < targetMeshes.size(); ++i) {
            aiMesh* targetMesh = targetMeshes.at(i);
            aiAnimMesh *animMesh = aiCreateAnimMesh(targetMesh);
            float weight = targetWeights[i];
            animMesh->mWeight = weight == 0 ? 1.0f : weight;
            animMesh->mName = targetMesh->mName;
            animMeshes.push_back(animMesh);
        }
        dstMesh->mMethod = (method == Collada::Relative)
            ? aiMorphingMethod_MORPH_RELATIVE
            : aiMorphingMethod_MORPH_NORMALIZED;
        dstMesh->mAnimMeshes = new aiAnimMesh*[animMeshes.size()];
        dstMesh->mNumAnimMeshes = static_cast<unsigned int>(animMeshes.size());
        for (unsigned int i = 0; i < animMeshes.size(); ++i) {
            dstMesh->mAnimMeshes[i] = animMeshes.at(i);
        }
    }

    // create bones if given
    if (pSrcController && pSrcController->mType == Collada::Skin) {
        // resolve references - joint names
        const Collada::Accessor& jointNamesAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mJointNameSource);
        const Collada::Data& jointNames = pParser.ResolveLibraryReference(pParser.mDataLibrary, jointNamesAcc.mSource);
        // joint offset matrices
        const Collada::Accessor& jointMatrixAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mJointOffsetMatrixSource);
        const Collada::Data& jointMatrices = pParser.ResolveLibraryReference(pParser.mDataLibrary, jointMatrixAcc.mSource);
        // joint vertex_weight name list - should refer to the same list as the joint names above. If not, report and reconsider
        const Collada::Accessor& weightNamesAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mWeightInputJoints.mAccessor);
        if (&weightNamesAcc != &jointNamesAcc)
            throw DeadlyImportError("Temporary implementational laziness. If you read this, please report to the author.");
        // vertex weights
        const Collada::Accessor& weightsAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mWeightInputWeights.mAccessor);
        const Collada::Data& weights = pParser.ResolveLibraryReference(pParser.mDataLibrary, weightsAcc.mSource);

        if (!jointNames.mIsStringArray || jointMatrices.mIsStringArray || weights.mIsStringArray)
            throw DeadlyImportError("Data type mismatch while resolving mesh joints");
        // sanity check: we rely on the vertex weights always coming as pairs of BoneIndex-WeightIndex
        if (pSrcController->mWeightInputJoints.mOffset != 0 || pSrcController->mWeightInputWeights.mOffset != 1)
            throw DeadlyImportError("Unsupported vertex_weight addressing scheme. ");

        // create containers to collect the weights for each bone
        size_t numBones = jointNames.mStrings.size();
        std::vector<std::vector<aiVertexWeight> > dstBones(numBones);

        // build a temporary array of pointers to the start of each vertex's weights
        typedef std::vector< std::pair<size_t, size_t> > IndexPairVector;
        std::vector<IndexPairVector::const_iterator> weightStartPerVertex;
        weightStartPerVertex.resize(pSrcController->mWeightCounts.size(), pSrcController->mWeights.end());

        IndexPairVector::const_iterator pit = pSrcController->mWeights.begin();
        for (size_t a = 0; a < pSrcController->mWeightCounts.size(); ++a) {
            weightStartPerVertex[a] = pit;
            pit += pSrcController->mWeightCounts[a];
        }

        // now for each vertex put the corresponding vertex weights into each bone's weight collection
        for (size_t a = pStartVertex; a < pStartVertex + numVertices; ++a) {
            // which position index was responsible for this vertex? that's also the index by which
            // the controller assigns the vertex weights
            size_t orgIndex = pSrcMesh->mFacePosIndices[a];
            // find the vertex weights for this vertex
            IndexPairVector::const_iterator iit = weightStartPerVertex[orgIndex];
            size_t pairCount = pSrcController->mWeightCounts[orgIndex];


            for( size_t b = 0; b < pairCount; ++b, ++iit) {
                const size_t jointIndex = iit->first;
                const size_t vertexIndex = iit->second;                
                ai_real weight = 1.0f;
                if (!weights.mValues.empty()) {
                    weight = ReadFloat(weightsAcc, weights, vertexIndex, 0);
                }

                // one day I gonna kill that XSI Collada exporter
                if (weight > 0.0f)
                {
                    aiVertexWeight w;
                    w.mVertexId = static_cast<unsigned int>(a - pStartVertex);
                    w.mWeight = weight;
                    dstBones[jointIndex].push_back(w);
                }
            }
        }

        // count the number of bones which influence vertices of the current submesh
        size_t numRemainingBones = 0;
        for( std::vector<std::vector<aiVertexWeight> >::const_iterator it = dstBones.begin(); it != dstBones.end(); ++it) {
            if( it->size() > 0) {
                ++numRemainingBones;
            }
        }

        // create bone array and copy bone weights one by one
        dstMesh->mNumBones = static_cast<unsigned int>(numRemainingBones);
        dstMesh->mBones = new aiBone*[numRemainingBones];
        size_t boneCount = 0;
        for( size_t a = 0; a < numBones; ++a) {
            // omit bones without weights
            if( dstBones[a].empty() ) {
                continue;
            }

            // create bone with its weights
            aiBone* bone = new aiBone;
            bone->mName = ReadString(jointNamesAcc, jointNames, a);
            bone->mOffsetMatrix.a1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 0);
            bone->mOffsetMatrix.a2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 1);
            bone->mOffsetMatrix.a3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 2);
            bone->mOffsetMatrix.a4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 3);
            bone->mOffsetMatrix.b1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 4);
            bone->mOffsetMatrix.b2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 5);
            bone->mOffsetMatrix.b3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 6);
            bone->mOffsetMatrix.b4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 7);
            bone->mOffsetMatrix.c1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 8);
            bone->mOffsetMatrix.c2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 9);
            bone->mOffsetMatrix.c3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 10);
            bone->mOffsetMatrix.c4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 11);
            bone->mNumWeights = static_cast<unsigned int>(dstBones[a].size());
            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            std::copy(dstBones[a].begin(), dstBones[a].end(), bone->mWeights);

            // apply bind shape matrix to offset matrix
            aiMatrix4x4 bindShapeMatrix;
            bindShapeMatrix.a1 = pSrcController->mBindShapeMatrix[0];
            bindShapeMatrix.a2 = pSrcController->mBindShapeMatrix[1];
            bindShapeMatrix.a3 = pSrcController->mBindShapeMatrix[2];
            bindShapeMatrix.a4 = pSrcController->mBindShapeMatrix[3];
            bindShapeMatrix.b1 = pSrcController->mBindShapeMatrix[4];
            bindShapeMatrix.b2 = pSrcController->mBindShapeMatrix[5];
            bindShapeMatrix.b3 = pSrcController->mBindShapeMatrix[6];
            bindShapeMatrix.b4 = pSrcController->mBindShapeMatrix[7];
            bindShapeMatrix.c1 = pSrcController->mBindShapeMatrix[8];
            bindShapeMatrix.c2 = pSrcController->mBindShapeMatrix[9];
            bindShapeMatrix.c3 = pSrcController->mBindShapeMatrix[10];
            bindShapeMatrix.c4 = pSrcController->mBindShapeMatrix[11];
            bindShapeMatrix.d1 = pSrcController->mBindShapeMatrix[12];
            bindShapeMatrix.d2 = pSrcController->mBindShapeMatrix[13];
            bindShapeMatrix.d3 = pSrcController->mBindShapeMatrix[14];
            bindShapeMatrix.d4 = pSrcController->mBindShapeMatrix[15];
            bone->mOffsetMatrix *= bindShapeMatrix;

            // HACK: (thom) Some exporters address the bone nodes by SID, others address them by ID or even name.
            // Therefore I added a little name replacement here: I search for the bone's node by either name, ID or SID,
            // and replace the bone's name by the node's name so that the user can use the standard
            // find-by-name method to associate nodes with bones.
            const Collada::Node* bnode = FindNode( pParser.mRootNode, bone->mName.data);
            if( !bnode) {
                bnode = FindNodeBySID( pParser.mRootNode, bone->mName.data);
            }

            // assign the name that we would have assigned for the source node
            if( bnode) {
                bone->mName.Set( FindNameForNode( bnode));
            } else {
                ASSIMP_LOG_WARN_F( "ColladaLoader::CreateMesh(): could not find corresponding node for joint \"", bone->mName.data, "\"." );
            }

            // and insert bone
            dstMesh->mBones[boneCount++] = bone;
        }
    }

    return dstMesh.release();
}